

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1Plane3Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi,Matrix<float,_4,_1,_0,_4,_1> *Nu
          ,bool verbose)

{
  float fVar1;
  float fVar2;
  float fVar3;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar5;
  ostream *poVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_180;
  Scalar local_17c;
  float local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  Type local_140;
  undefined1 local_108 [16];
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108 = ZEXT416((uint)(Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                            m_storage.m_data.array[0]);
  local_178 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  fVar10 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  local_15c = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar1 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  local_160 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxRot;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  auxRot.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0
  ;
  fVar7 = local_178 * local_178;
  fVar8 = SQRT(fVar7 + fVar10 * fVar10);
  local_17c = -fVar10 / fVar8;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_140,
                      &local_17c);
  local_180 = local_178 / fVar8;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_180);
  fVar7 = SQRT(fVar10 * fVar10 + (float)local_108._0_4_ * (float)local_108._0_4_ + fVar7);
  local_144 = fVar8 / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_144);
  fVar9 = -(float)local_108._0_4_;
  local_148 = ((local_178 * fVar9) / fVar8) / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_148);
  local_14c = ((fVar9 * fVar10) / fVar8) / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_14c);
  local_150 = (float)local_108._0_4_ / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_150);
  local_154 = local_178 / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_154);
  local_158 = fVar10 / fVar7;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&local_158);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_140);
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxT;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_17c = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_140,
                      &local_17c);
  local_180 = local_15c * fVar7;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar5,&local_180);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_140);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)&local_140,4,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (&auxTrans,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
              *)&local_140);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>(&local_140,&auxTrans,3,3)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            (&local_140,&auxRot);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_140,&auxTrans,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_140,&auxT);
  if (verbose) {
    poVar6 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&auxTrans);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&auxTrans;
    local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&auxTrans;
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_140);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&auxTrans);
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  auxRot.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0
  ;
  local_178 = fVar2 * fVar2;
  fVar10 = SQRT(local_178 + fVar3 * fVar3);
  local_17c = -fVar3 / fVar10;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxRot;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_140,
                      &local_17c);
  local_180 = fVar2 / fVar10;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_180);
  fVar7 = SQRT(fVar3 * fVar3 + fVar1 * fVar1 + local_178);
  local_144 = fVar10 / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_144);
  local_178 = -fVar1;
  uStack_174 = 0x80000000;
  uStack_170 = 0x80000000;
  uStack_16c = 0x80000000;
  local_108._0_8_ = (double)fVar7;
  local_148 = (float)(((double)(fVar2 * local_178) / (double)fVar10) / (double)fVar7);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_148);
  local_14c = (float)(((double)(local_178 * fVar3) / (double)fVar10) / (double)local_108._0_8_);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_14c);
  local_150 = fVar1 / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_150);
  local_154 = fVar2 / fVar7;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_154);
  local_158 = fVar3 / fVar7;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&local_158);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_140);
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_17c = 0.0;
  local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxT;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_140,
                      &local_17c);
  local_180 = local_160 * fVar7;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar5,&local_180);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_140);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)&local_140,4,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (&auxTrans,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
              *)&local_140);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>(&local_140,&auxTrans,3,3)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            (&local_140,&auxRot);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_140,&auxTrans,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_140,&auxT);
  if (verbose) {
    poVar6 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&auxTrans);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&auxTrans;
    local_140.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&auxTrans;
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_140);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&auxTrans);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations1Plane3Line(
	Matrix<floatPrec, 4, 1> Pi, Matrix<floatPrec, 4, 1> Nu,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec nu11, nu12, nu13, nu14;

	pi11 = Pi(0);
	pi12 = Pi(1);
	pi13 = Pi(2);
	pi14 = Pi(3);
	nu11 = Nu(0);
	nu12 = Nu(1);
	nu13 = Nu(2);
	nu14 = Nu(3);

	// Compute U Matrix
	auxRot << 0.0,
		-pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0, 0.0, pi14 * sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 0.0,
		-nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0, 0.0, nu14 * sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}